

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AdvancedReadWriteCase1::Run(AdvancedReadWriteCase1 *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 *puVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  vec3 *expected;
  long lVar7;
  allocator<char> local_6a;
  allocator<char> local_69;
  float data [8];
  string local_48;
  
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,1)
  ;
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)data,
               "\nlayout(location = 0) in vec4 g_in_position;\ncoherent buffer Buffer {\n  vec4 in_color;\n  vec4 out_color;\n} g_buffer;\nvoid main() {\n  if (gl_VertexID == 0) {\n    g_buffer.out_color = g_buffer.in_color;\n    memoryBarrier();\n  }\n  gl_Position = g_in_position;\n}"
               ,&local_69);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "\nlayout(location = 0) out vec4 g_fs_out;\ncoherent buffer Buffer {\n  vec4 in_color;\n  vec4 out_color;\n} g_buffer;\nvoid main() {\n  g_fs_out = g_buffer.out_color;\n}"
               ,&local_6a);
    GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,(string *)data,&local_48);
    this->m_program = GVar2;
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)data);
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    lVar7 = -1;
    if (bVar1) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x20,(void *)0x0,0x88e8);
      puVar6 = (undefined8 *)glu::CallLogWrapper::glMapBuffer(this_00,0x90d2,0x88b9);
      if (puVar6 != (undefined8 *)0x0) {
        *puVar6 = 0x3f80000000000000;
        puVar6[1] = 0x3f80000000000000;
        puVar6[2] = 0;
        puVar6[3] = 0;
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
        data[4] = -1.0;
        data[5] = 1.0;
        data[6] = 1.0;
        data[7] = 1.0;
        data[0] = -1.0;
        data[1] = -1.0;
        data[2] = 1.0;
        data[3] = -1.0;
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_vertex_buffer);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
        glu::CallLogWrapper::glBufferData(this_00,0x8892,0x20,data,0x88e4);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
        glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
        iVar5 = 0;
        expected = (vec3 *)0x0;
        glu::CallLogWrapper::glVertexAttribPointer(this_00,0,2,0x1406,'\0',0,(void *)0x0);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
        glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
        glu::CallLogWrapper::glBindVertexArray(this_00,0);
        glu::CallLogWrapper::glClear(this_00,0x4000);
        glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
        glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
        iVar3 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  m_context)->m_renderCtx->_vptr_RenderContext[4])();
        iVar3 = *(int *)CONCAT44(extraout_var,iVar3);
        iVar4 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  m_context)->m_renderCtx->_vptr_RenderContext[4])();
        data[0] = 0.0;
        data[1] = 1.0;
        data._8_8_ = data._8_8_ & 0xffffffff00000000;
        bVar1 = ShaderStorageBufferObjectBase::ValidateReadBuffer
                          (&this->super_ShaderStorageBufferObjectBase,iVar3,
                           *(int *)(CONCAT44(extraout_var_00,iVar4) + 4),(int)data,iVar5,expected);
        if (bVar1) {
          iVar3 = 2;
          puVar6 = (undefined8 *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x10,2);
          if (puVar6 != (undefined8 *)0x0) {
            *puVar6 = 0x3f800000;
            puVar6[1] = 0x3f8000003f800000;
            glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
            glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
            iVar4 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper
                      .m_context)->m_renderCtx->_vptr_RenderContext[4])();
            iVar4 = *(int *)CONCAT44(extraout_var_01,iVar4);
            iVar5 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper
                      .m_context)->m_renderCtx->_vptr_RenderContext[4])();
            data[0] = 1.0;
            data[1] = 0.0;
            data[2] = 1.0;
            bVar1 = ShaderStorageBufferObjectBase::ValidateReadBuffer
                              (&this->super_ShaderStorageBufferObjectBase,iVar4,
                               *(int *)(CONCAT44(extraout_var_02,iVar5) + 4),(int)data,iVar3,
                               expected);
            lVar7 = (ulong)bVar1 - 1;
          }
        }
      }
    }
  }
  else {
    lVar7 = 0x10;
  }
  return lVar7;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;

		const char* const glsl_vs = NL "layout(location = 0) in vec4 g_in_position;" NL "coherent buffer Buffer {" NL
									   "  vec4 in_color;" NL "  vec4 out_color;" NL "} g_buffer;" NL "void main() {" NL
									   "  if (gl_VertexID == 0) {" NL "    g_buffer.out_color = g_buffer.in_color;" NL
									   "    memoryBarrier();" NL "  }" NL "  gl_Position = g_in_position;" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_fs_out;" NL "coherent buffer Buffer {" NL "  vec4 in_color;" NL
			   "  vec4 out_color;" NL "} g_buffer;" NL "void main() {" NL "  g_fs_out = g_buffer.out_color;" NL "}";

		m_program = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 2 * sizeof(float) * 4, NULL, GL_DYNAMIC_DRAW);
		float* ptr = reinterpret_cast<float*>(glMapBuffer(GL_SHADER_STORAGE_BUFFER, GL_WRITE_ONLY));
		if (!ptr)
			return ERROR;
		*ptr++ = 0.0f;
		*ptr++ = 1.0f;
		*ptr++ = 0.0f;
		*ptr++ = 1.0f;
		*ptr++ = 0.0f;
		*ptr++ = 0.0f;
		*ptr++ = 0.0f;
		*ptr++ = 0.0f;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		/* vertex buffer */
		{
			const float data[] = { -1, -1, 1, -1, -1, 1, 1, 1 };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec3(0, 1, 0)))
		{
			return ERROR;
		}

		// update input color
		ptr = reinterpret_cast<float*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(float) * 4, GL_MAP_WRITE_BIT));
		if (!ptr)
			return ERROR;
		*ptr++ = 1.0f;
		*ptr++ = 0.0f;
		*ptr++ = 1.0f;
		*ptr++ = 1.0f;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec3(1.0f, 0.0f, 1.0f)))
		{
			return ERROR;
		}

		return NO_ERROR;
	}